

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::StreamingReporterBase::~StreamingReporterBase(StreamingReporterBase *this)

{
  Ptr<const_Catch::IConfig> *in_RDI;
  vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *unaff_retaddr;
  
  in_RDI->m_p = (IConfig *)&PTR__StreamingReporterBase_001f0aa0;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector(unaff_retaddr);
  LazyStat<Catch::TestCaseInfo>::~LazyStat((LazyStat<Catch::TestCaseInfo> *)0x181b6e);
  LazyStat<Catch::GroupInfo>::~LazyStat((LazyStat<Catch::GroupInfo> *)0x181b7c);
  LazyStat<Catch::TestRunInfo>::~LazyStat((LazyStat<Catch::TestRunInfo> *)0x181b8a);
  Ptr<const_Catch::IConfig>::~Ptr(in_RDI);
  SharedImpl<Catch::IStreamingReporter>::~SharedImpl
            ((SharedImpl<Catch::IStreamingReporter> *)0x181ba2);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}